

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

void __thiscall
pbrt::PiecewiseLinearSpectrum::PiecewiseLinearSpectrum
          (PiecewiseLinearSpectrum *this,span<const_float> l,span<const_float> v,Allocator alloc)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  float *pfVar4;
  size_t sVar5;
  size_t vb;
  size_t va;
  
  va = (size_t)alloc.memoryResource;
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)this,l.ptr,l.ptr + l.n,
             (polymorphic_allocator<float> *)&va);
  va = (size_t)alloc.memoryResource;
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)&this->values,v.ptr,
             v.ptr + v.n,(polymorphic_allocator<float> *)&va);
  sVar3 = (this->lambdas).nStored;
  vb = (this->values).nStored;
  va = sVar3;
  if (sVar3 != vb) {
    LogFatal<char_const(&)[15],char_const(&)[14],char_const(&)[15],unsigned_long&,char_const(&)[14],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum.cpp"
               ,0x56,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [15])"lambdas.size()",
               (char (*) [14])"values.size()",(char (*) [15])"lambdas.size()",(unsigned_long *)&va,
               (char (*) [14])"values.size()",&vb);
  }
  pfVar4 = (this->lambdas).ptr;
  sVar5 = 1;
  while( true ) {
    if (sVar3 == sVar5) {
      return;
    }
    fVar1 = pfVar4[sVar5 - 1];
    va = CONCAT44(va._4_4_,fVar1);
    fVar2 = pfVar4[sVar5];
    vb = CONCAT44(vb._4_4_,fVar2);
    if (fVar2 <= fVar1) break;
    sVar5 = sVar5 + 1;
  }
  LogFatal<char_const(&)[11],char_const(&)[15],char_const(&)[11],float&,char_const(&)[15],float&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum.cpp"
             ,0x58,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [11])"lambdas[i]",
             (char (*) [15])"lambdas[i + 1]",(char (*) [11])"lambdas[i]",(float *)&va,
             (char (*) [15])"lambdas[i + 1]",(float *)&vb);
}

Assistant:

PiecewiseLinearSpectrum::PiecewiseLinearSpectrum(pstd::span<const Float> l,
                                                 pstd::span<const Float> v,
                                                 Allocator alloc)
    : lambdas(l.begin(), l.end(), alloc), values(v.begin(), v.end(), alloc) {
    CHECK_EQ(lambdas.size(), values.size());
    for (size_t i = 0; i < lambdas.size() - 1; ++i)
        CHECK_LT(lambdas[i], lambdas[i + 1]);
}